

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

w3Limits __thiscall w3Module::read_limits(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  w3Limits wVar6;
  allocator<char> local_49;
  string local_48;
  
  bVar1 = read_byte(this,cursor);
  if (1 < bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"invalid limit tag",&local_49);
    ThrowString(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  uVar2 = read_varuint32(this,cursor);
  if (bVar1 == 1) {
    uVar3 = read_varuint32(this,cursor);
    uVar4 = (ulong)uVar3 << 0x20;
    uVar5 = extraout_RDX_00;
  }
  else {
    uVar4 = 0;
    uVar5 = extraout_RDX;
  }
  wVar6._8_4_ = (undefined4)CONCAT71((int7)((ulong)uVar5 >> 8),bVar1 == 1);
  wVar6.min = (int)(uVar2 | uVar4);
  wVar6.max = (int)((uVar2 | uVar4) >> 0x20);
  return wVar6;
}

Assistant:

w3Limits w3Module::read_limits (uint8_t** cursor)
{
    w3Limits limits;
    const uint32_t tag = read_byte (cursor);
    switch (tag)
    {
    case 0:
    case 1:
        break;
    default:
        ThrowString ("invalid limit tag");
        break;
    }
    limits.hasMax = (tag == 1);
    limits.min = read_varuint32 (cursor);
    if (limits.hasMax)
        limits.max = read_varuint32 (cursor);
    return limits;
}